

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fSamplerStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::SamplerStateQueryTests::init
          (SamplerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  QueryType queryType;
  TestContext *testCtx;
  RenderContext *renderCtx;
  anon_struct_24_3_b27fdac0 *paVar1;
  TestNode *node;
  char *__rhs;
  long lVar2;
  allocator<char> local_d9;
  TestNode *local_d8;
  long local_d0;
  anon_struct_24_3_b27fdac0 *local_c8;
  char *local_c0;
  long local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8 = (TestNode *)this;
  for (local_d0 = 0; local_d0 != 9; local_d0 = local_d0 + 1) {
    local_c8 = init::states + local_d0;
    local_c0 = init::states[local_d0].name;
    lVar2 = 0;
    while (lVar2 != 8) {
      queryType = *(QueryType *)
                   ((long)gles31::Functional::SamplerStateQueryTests::init()::nonPureVerifiers +
                   lVar2);
      testCtx = local_d8->m_testCtx;
      renderCtx = ((Context *)local_d8[1]._vptr_TestNode)->m_renderCtx;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_50,&local_b0,local_c0);
      __rhs = (char *)0x0;
      if (lVar2 == 4) {
        __rhs = "_getsamplerparameterf";
      }
      if (lVar2 == 0) {
        __rhs = "_getsamplerparameteri";
      }
      std::operator+(&local_90,&local_50,__rhs);
      paVar1 = local_c8;
      local_b8 = lVar2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,local_c8->desc,&local_d9);
      node = &deqp::gls::TextureStateQueryTests::createSamplerParamTest
                        (testCtx,renderCtx,&local_90,&local_70,queryType,paVar1->tester)->
              super_TestNode;
      tcu::TestNode::addChild(local_d8,node);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      lVar2 = local_b8 + 4;
    }
  }
  return 9;
}

Assistant:

void SamplerStateQueryTests::init (void)
{
	using namespace gls::TextureStateQueryTests;

	static const QueryType verifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER,
		QUERY_SAMPLER_PARAM_FLOAT
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
	} states[] =
	{
		{ "sampler_texture_wrap_s",				"TEXTURE_WRAP_S",			TESTER_TEXTURE_WRAP_S			},
		{ "sampler_texture_wrap_t",				"TEXTURE_WRAP_T",			TESTER_TEXTURE_WRAP_T			},
		{ "sampler_texture_wrap_r",				"TEXTURE_WRAP_R",			TESTER_TEXTURE_WRAP_R			},
		{ "sampler_texture_mag_filter",			"TEXTURE_MAG_FILTER",		TESTER_TEXTURE_MAG_FILTER		},
		{ "sampler_texture_min_filter",			"TEXTURE_MIN_FILTER",		TESTER_TEXTURE_MIN_FILTER		},
		{ "sampler_texture_min_lod",			"TEXTURE_MIN_LOD",			TESTER_TEXTURE_MIN_LOD			},
		{ "sampler_texture_max_lod",			"TEXTURE_MAX_LOD",			TESTER_TEXTURE_MAX_LOD			},
		{ "sampler_texture_compare_mode",		"TEXTURE_COMPARE_MODE",		TESTER_TEXTURE_COMPARE_MODE		},
		{ "sampler_texture_compare_func",		"TEXTURE_COMPARE_FUNC",		TESTER_TEXTURE_COMPARE_FUNC		},
	};

	for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
	{
		FOR_EACH_VERIFIER(verifiers, addChild(createSamplerParamTest(m_testCtx,
																	 m_context.getRenderContext(),
																	 std::string() + states[stateNdx].name + getVerifierSuffix(verifier),
																	 states[stateNdx].desc,
																	 verifier,
																	 states[stateNdx].tester)));
	}
}